

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int parse_key(char *ascii,uint8_t *key)

{
  long lVar1;
  undefined2 local_27;
  undefined1 local_25;
  int local_24;
  char byte [3];
  uint8_t *puStack_20;
  int i;
  uint8_t *key_local;
  char *ascii_local;
  
  local_24 = 0;
  puStack_20 = key;
  while( true ) {
    if (0x1f < local_24) {
      if (ascii[local_24 << 1] == '\0') {
        ascii_local._4_4_ = 0;
      }
      else {
        ascii_local._4_4_ = -1;
      }
      return ascii_local._4_4_;
    }
    local_27 = *(undefined2 *)(ascii + (local_24 << 1));
    local_25 = 0;
    lVar1 = strtol((char *)&local_27,(char **)0x0,0x10);
    puStack_20[local_24] = (uint8_t)lVar1;
    if ((puStack_20[local_24] == '\0') && (((char)local_27 != '0' || (local_27._1_1_ != '0'))))
    break;
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

int parse_key(const char *ascii, uint8_t key[0x20]) {
  int i;
  for (i = 0; i < 0x20; i++) {
    char byte[3];
    memcpy(byte, &ascii[2*i], 2);
    byte[2] = '\0';
    key[i] = strtol(byte, NULL, 16);
    if (key[i] == 0 && !(byte[0] == '0' && byte[1] == '0')) {
      return -1;
    }
  }
  if (ascii[2*i] != '\0') {
    return -1;
  } else {
    return 0;
  }
}